

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_test.cc
# Opt level: O2

int main(void)

{
  uint __line;
  int iVar1;
  State *s;
  State *s_00;
  Context *this;
  char *__assertion;
  
  s = (State *)operator_new(8);
  s->_vptr_State = (_func_int **)&PTR_handle_00103d68;
  s_00 = (State *)operator_new(8);
  s_00->_vptr_State = (_func_int **)&PTR_handle_00103da8;
  this = (Context *)operator_new(8);
  this->state = (State *)0x0;
  Context::setState(this,s);
  iVar1 = (**this->state->_vptr_State)();
  if (iVar1 == 10) {
    Context::setState(this,s_00);
    iVar1 = (**this->state->_vptr_State)();
    if (iVar1 == 100) {
      return 0;
    }
    __assertion = "value == 100";
    __line = 0x13;
  }
  else {
    __assertion = "value == 10";
    __line = 0xf;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/state_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {
  State *stateA = new ConcreteStateA;
  State *stateB = new ConcreteStateB;

  Context *context = new Context;

  context->setState(stateA);
  int value = context->request();
  assert(value == 10);

  context->setState(stateB);
  value = context->request();
  assert(value == 100);
}